

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_mode_desc(crn_mip_mode m)

{
  char *pcStack_10;
  crn_mip_mode m_local;
  
  switch(m) {
  case cCRNMipModeUseSourceOrGenerateMips:
    pcStack_10 = "Use source/generate if none";
    break;
  case cCRNMipModeUseSourceMips:
    pcStack_10 = "Only use source MIP maps (if any)";
    break;
  case cCRNMipModeGenerateMips:
    pcStack_10 = "Always generate new MIP maps";
    break;
  case cCRNMipModeNoMips:
    pcStack_10 = "No MIP maps";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_mip_mode_desc(crn_mip_mode m)
{
    switch (m)
    {
    case cCRNMipModeUseSourceOrGenerateMips:
        return "Use source/generate if none";
    case cCRNMipModeUseSourceMips:
        return "Only use source MIP maps (if any)";
    case cCRNMipModeGenerateMips:
        return "Always generate new MIP maps";
    case cCRNMipModeNoMips:
        return "No MIP maps";
    default:
        break;
    }
    return "?";
}